

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

ServiceDescriptor * __thiscall
google::protobuf::FileDescriptor::FindServiceByName(FileDescriptor *this,string *key)

{
  __node_ptr p_Var1;
  char *pcVar2;
  __hash_code __c;
  long lVar3;
  ServiceDescriptor *pSVar4;
  char cVar5;
  key_type local_18;
  
  local_18.second = (key->_M_dataplus)._M_p;
  cVar5 = *local_18.second;
  if (cVar5 == '\0') {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    pcVar2 = local_18.second;
    do {
      pcVar2 = pcVar2 + 1;
      lVar3 = (long)cVar5 + lVar3 * 5;
      cVar5 = *pcVar2;
    } while (cVar5 != '\0');
  }
  __c = (long)this * 0xffff + lVar3;
  pSVar4 = (ServiceDescriptor *)0x0;
  local_18.first = this;
  p_Var1 = std::
           _Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_node(*(_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                            **)(this + 0xa8),
                          __c % (*(_Hashtable<std::pair<const_void_*,_const_char_*>,_std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_std::allocator<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::(anonymous_namespace)::PointerStringPairEqual,_google::protobuf::(anonymous_namespace)::PointerStringPairHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                   **)(this + 0xa8))->_M_bucket_count,&local_18,__c);
  if (p_Var1 != (__node_ptr)0x0) {
    if (*(int *)((long)&(p_Var1->
                        super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
                        ._M_storage._M_storage + 0x10) == 6) {
      pSVar4 = *(ServiceDescriptor **)
                ((long)&(p_Var1->
                        super__Hash_node_value<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>,_true>
                        ).
                        super__Hash_node_value_base<std::pair<const_std::pair<const_void_*,_const_char_*>,_google::protobuf::Symbol>_>
                        ._M_storage._M_storage + 0x18);
    }
    else {
      pSVar4 = (ServiceDescriptor *)0x0;
    }
  }
  return pSVar4;
}

Assistant:

const ServiceDescriptor*
FileDescriptor::FindServiceByName(const string& key) const {
  Symbol result = tables_->FindNestedSymbolOfType(this, key, Symbol::SERVICE);
  if (!result.IsNull()) {
    return result.service_descriptor;
  } else {
    return NULL;
  }
}